

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O3

uint GetAllocaAddress(InstructionVMEvalContext *ctx,VariableData *container)

{
  VmFunction *pVVar1;
  VariableData *pVVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = (ctx->stackFrames).count;
  if (uVar3 == 0) {
    __assert_fail("count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x172,
                  "T &SmallArray<InstructionVMEvalContext::StackFrame *, 32>::back() [T = InstructionVMEvalContext::StackFrame *, N = 32]"
                 );
  }
  pVVar1 = (ctx->stackFrames).data[uVar3 - 1]->owner;
  uVar4 = (ulong)(pVVar1->allocas).count;
  if (uVar4 != 0) {
    uVar3 = 8;
    uVar5 = 0;
    do {
      pVVar2 = (pVVar1->allocas).data[uVar5];
      if (pVVar2 == container) {
        return uVar3;
      }
      uVar3 = uVar3 + (int)pVVar2->type->size;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return 0;
}

Assistant:

unsigned GetAllocaAddress(InstructionVMEvalContext &ctx, VariableData *container)
{
	InstructionVMEvalContext::StackFrame *frame = ctx.stackFrames.back();

	unsigned offset = 8;

	for(unsigned i = 0; i < frame->owner->allocas.size(); i++)
	{
		VariableData *data = frame->owner->allocas[i];

		if(container == data)
			return offset;

		offset += unsigned(data->type->size);
	}

	return 0;
}